

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarView::mouseReleaseEvent(QCalendarView *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  MouseButton MVar3;
  int iVar4;
  QDate _t1;
  QStyle *pQVar5;
  QSinglePointEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QCalendarModel *calendarModel;
  QAbstractItemView *in_stack_00000028;
  QDate date;
  QDate in_stack_ffffffffffffffb8;
  QMouseEvent *in_stack_ffffffffffffffe0;
  QCalendarView *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)in_RSI);
  _t1.jd = (qint64)qobject_cast<QtPrivate::QCalendarModel*>((QObject *)0x51aee7);
  if ((QCalendarModel *)_t1.jd == (QCalendarModel *)0x0) {
    QAbstractItemView::mouseReleaseEvent(in_stack_00000028,(QMouseEvent *)this);
  }
  else {
    MVar3 = QSinglePointEvent::button(in_RSI);
    if ((MVar3 == LeftButton) && ((*(byte *)(in_RDI + 0x28) & 1) == 0)) {
      if ((*(byte *)(in_RDI + 0x29) & 1) == 0) {
        QEvent::ignore((QEvent *)in_RSI);
      }
      else {
        handleMouseEvent(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
        bVar2 = QDate::isValid((QDate *)in_RSI);
        if (bVar2) {
          changeDate((QCalendarView *)in_stack_ffffffffffffffb8.jd,_t1,
                     SUB81((ulong)in_RDI >> 0x38,0));
          clicked((QCalendarView *)0x51afa2,in_stack_ffffffffffffffb8);
          pQVar5 = QWidget::style((QWidget *)in_stack_ffffffffffffffb8.jd);
          iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x3d,0,in_RDI);
          if (iVar4 != 0) {
            editingFinished((QCalendarView *)0x51afd9);
          }
        }
        *(undefined1 *)(in_RDI + 0x29) = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarView::mouseReleaseEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseReleaseEvent(event);
        return;
    }

    if (event->button() != Qt::LeftButton)
        return;

    if (readOnly)
        return;

    if (validDateClicked) {
        QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            emit changeDate(date, true);
            emit clicked(date);
            if (style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
                emit editingFinished();
        }
        validDateClicked = false;
    } else {
        event->ignore();
    }
}